

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O2

int exhaustive_parse(Parser *p,int state)

{
  uint32 *puVar1;
  d_loc_t *start_loc;
  uint *puVar2;
  Shift **ppSVar3;
  SNode **ppSVar4;
  anon_struct_40_4_d8687ec6_for_error_reductions *v;
  D_Reduction **ppDVar5;
  int *piVar6;
  unsigned_short uVar7;
  undefined2 uVar8;
  int iVar9;
  char *pcVar10;
  D_ErrorRecoveryHint *pDVar11;
  D_Reduction **ppDVar12;
  SNode *pSVar13;
  D_State *pDVar14;
  PNode *pPVar15;
  SNode **ppSVar16;
  long lVar17;
  d_loc_t *pdVar18;
  bool bVar19;
  char *pcVar20;
  char *pcVar21;
  D_ErrorRecoveryHint *pDVar22;
  uint uVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  int iVar27;
  SNode *pSVar28;
  PNode *pPVar29;
  ZNode *pZVar30;
  void *__ptr;
  size_t sVar31;
  D_Reduction *elem;
  Reduction *pRVar32;
  ZNode *pZVar33;
  ShiftResult *pSVar34;
  D_Shift *pDVar35;
  long lVar36;
  uint i;
  uint uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  SNode **ppSVar41;
  Shift *pSVar42;
  Shift **ppSVar43;
  Shift *__ptr_00;
  D_Shift **ppDVar44;
  VecSNode *v_00;
  long lVar45;
  D_Shift **ppDVar46;
  char *pcVar47;
  long *plVar48;
  D_ErrorRecoveryHint *pDVar49;
  Shift **ppSVar50;
  Shift *pSVar51;
  ulong uVar52;
  bool bVar53;
  SNode *local_1e0;
  char *local_1b8;
  char *local_1b0;
  D_ErrorRecoveryHint *local_198;
  d_loc_t loc_1;
  d_loc_t local_158;
  char *local_138;
  char *local_130;
  d_loc_t loc;
  PNode tpn;
  
  pcVar10 = p->start;
  (p->user).loc.s = pcVar10;
  (p->user).loc.ws = pcVar10;
  loc.ws = (p->user).loc.ws;
  loc.col = (p->user).loc.col;
  loc.line = (p->user).loc.line;
  loc.s = (p->user).loc.s;
  loc.pathname = (p->user).loc.pathname;
  (*(p->user).initial_white_space_fn)(&p->user,&loc,(void **)p);
  pSVar28 = add_SNode(p,p->t->state + state,&loc,p->top_scope);
  memset(&tpn,0,0xd8);
  tpn.initial_scope = p->top_scope;
  tpn.parse_node.end = loc.s;
  pPVar29 = pSVar28->last_pn;
  tpn.parse_node.scope = tpn.initial_scope;
  if (pPVar29 != (PNode *)0x0) {
    puVar1 = &pPVar29->refcount;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      free_PNode(p,pPVar29);
    }
  }
  start_loc = &(p->user).loc;
  pPVar29 = add_PNode(p,0,&loc,loc.s,&tpn,(D_Reduction *)0x0,(VecZNode *)0x0,(D_Shift *)0x0);
  pPVar29->refcount = pPVar29->refcount + 1;
  pSVar28->last_pn = pPVar29;
  pZVar30 = new_ZNode(p,pPVar29);
  set_add_znode(&pSVar28->zns,pZVar30);
  ppSVar3 = &p->shifts_todo;
  ppSVar4 = &(p->snode_hash).last_all;
  v = &p->error_reductions;
  ppDVar5 = (p->error_reductions).e;
  local_1b8 = (char *)0x0;
  iVar27 = 0;
  do {
    while( true ) {
      pRVar32 = p->reductions_todo;
      while (__ptr_00 = *ppSVar3, pRVar32 != (Reduction *)0x0) {
        pcVar10 = (pRVar32->snode->loc).s;
        if ((__ptr_00 != (Shift *)0x0) && ((__ptr_00->snode->loc).s < pcVar10)) goto LAB_00142cac;
        if (local_1b8 < pcVar10) {
          free_old_nodes(p);
          local_1b8 = pcVar10;
        }
        while ((pRVar32 = p->reductions_todo, pRVar32 != (Reduction *)0x0 &&
               ((pRVar32->snode->loc).s == pcVar10))) {
          p->reductions_todo = pRVar32->next;
          reduce_one(p,pRVar32);
        }
      }
      if (__ptr_00 != (Shift *)0x0) break;
      if (p->accept != (SNode *)0x0) {
        if ((p->accept->loc).s == p->end) {
          return 0;
        }
        if ((p->user).partial_parses != 0) {
          return 0;
        }
      }
      pSVar28 = *ppSVar4;
      if (pSVar28 == (SNode *)0x0) {
        return 1;
      }
      pcVar10 = (pSVar28->loc).s;
      pcVar47 = (pSVar28->loc).pathname;
      iVar24 = (pSVar28->loc).col;
      iVar9 = (pSVar28->loc).line;
      (p->user).loc.ws = (pSVar28->loc).ws;
      (p->user).loc.col = iVar24;
      (p->user).loc.line = iVar9;
      start_loc->s = pcVar10;
      (p->user).loc.pathname = pcVar47;
      if ((p->user).error_recovery == 0) {
        return 1;
      }
      __ptr = malloc(80000);
      iVar24 = (p->user).loc.line;
      if (p->last_syntax_error_line < iVar24) {
        p->last_syntax_error_line = iVar24;
        piVar6 = &(p->user).syntax_errors;
        *piVar6 = *piVar6 + 1;
        (*(p->user).syntax_error_fn)(&p->user);
      }
      uVar26 = 0;
      ppSVar41 = ppSVar4;
      while (pSVar28 = *ppSVar41, pSVar28 != (SNode *)0x0) {
        if (-1 < (int)*(uint *)&pSVar28->field_0x24) {
          *(uint *)&pSVar28->field_0x24 = *(uint *)&pSVar28->field_0x24 | 0x80000000;
          if (uVar26 < 9999) {
            uVar40 = (ulong)uVar26;
            uVar26 = uVar26 + 1;
            *(SNode **)((long)__ptr + uVar40 * 8) = pSVar28;
          }
          else {
            fwrite("exceeded error recovery queue size\n",0x23,1,_stderr);
          }
        }
        ppSVar41 = &pSVar28->all_next;
      }
      local_130 = ((*ppSVar4)->loc).s;
      local_138 = local_130 + 1;
      uVar40 = 0;
      local_198 = (D_ErrorRecoveryHint *)0x0;
      local_1b0 = (char *)0x0;
      local_1e0 = (SNode *)0x0;
      while (uVar40 < uVar26) {
        pSVar28 = *(SNode **)((long)__ptr + uVar40 * 8);
        uVar39 = (ulong)(pSVar28->state->error_recovery_hints).n;
        if (uVar39 != 0) {
          pDVar11 = (pSVar28->state->error_recovery_hints).v;
          for (uVar52 = 0; uVar52 != uVar39; uVar52 = uVar52 + 1) {
            pcVar10 = pDVar11[uVar52].string;
            sVar31 = strlen(pcVar10);
            uVar38 = sVar31 & 0xffffffff;
            pcVar47 = local_130;
            pSVar13 = local_1e0;
            pcVar21 = local_1b0;
            pDVar22 = local_198;
            if (uVar38 == 1) {
              pcVar20 = local_138;
              do {
                pcVar47 = pcVar20;
                if (pcVar47[-1] == '\0') {
                  if (*pcVar10 != '\0') goto LAB_00142b67;
                  break;
                }
                pcVar20 = pcVar47 + 1;
              } while (pcVar47[-1] != *pcVar10);
LAB_00142b27:
              pDVar49 = pDVar11 + uVar52;
              pSVar13 = pSVar28;
              pcVar21 = pcVar47;
              pDVar22 = pDVar49;
              if ((((local_1e0 != (SNode *)0x0) && (local_1b0 <= pcVar47)) &&
                  (pSVar13 = local_1e0, pcVar21 = local_1b0, pDVar22 = local_198,
                  pcVar47 == local_1b0)) &&
                 (((uVar23 = *(uint *)&local_1e0->field_0x24 & 0x7fffffff,
                   uVar37 = *(uint *)&pSVar28->field_0x24 & 0x7fffffff, pSVar13 = pSVar28,
                   pcVar21 = pcVar47, pDVar22 = pDVar49, uVar37 <= uVar23 &&
                   (pSVar13 = local_1e0, pcVar21 = local_1b0, pDVar22 = local_198, uVar23 == uVar37)
                   ) && (pSVar13 = pSVar28, pcVar21 = pcVar47, pDVar22 = pDVar49,
                        pDVar49->depth <= local_198->depth)))) {
                pSVar13 = local_1e0;
                pcVar21 = local_1b0;
                pDVar22 = local_198;
              }
            }
            else {
              for (; *pcVar47 != '\0'; pcVar47 = pcVar47 + 1) {
                iVar24 = strncmp(pcVar10,pcVar47,uVar38);
                if (iVar24 == 0) {
                  pcVar47 = pcVar47 + uVar38;
                  goto LAB_00142b27;
                }
              }
            }
LAB_00142b67:
            local_198 = pDVar22;
            local_1b0 = pcVar21;
            local_1e0 = pSVar13;
          }
        }
        uVar40 = uVar40 + 1;
        for (uVar39 = 0; uVar39 < (pSVar28->zns).n; uVar39 = uVar39 + 1) {
          pZVar30 = (pSVar28->zns).v[uVar39];
          if (pZVar30 != (ZNode *)0x0) {
            for (uVar52 = 0; uVar52 < (pZVar30->sns).n; uVar52 = uVar52 + 1) {
              pSVar13 = (pZVar30->sns).v[uVar52];
              if (-1 < (int)*(uint *)&pSVar13->field_0x24) {
                *(uint *)&pSVar13->field_0x24 = *(uint *)&pSVar13->field_0x24 | 0x80000000;
                if (uVar26 < 9999) {
                  uVar38 = (ulong)uVar26;
                  uVar26 = uVar26 + 1;
                  *(SNode **)((long)__ptr + uVar38 * 8) = pSVar13;
                }
                else {
                  fwrite("exceeded error recovery queue size\n",0x23,1,_stderr);
                }
              }
              pZVar30 = (pSVar28->zns).v[uVar39];
            }
          }
        }
      }
      for (uVar40 = 0; uVar26 != uVar40; uVar40 = uVar40 + 1) {
        puVar2 = (uint *)(*(long *)((long)__ptr + uVar40 * 8) + 0x24);
        *puVar2 = *puVar2 & 0x7fffffff;
      }
      if (local_1e0 == (SNode *)0x0) goto LAB_001435e9;
      elem = (D_Reduction *)calloc(1,0x38);
      pRVar32 = (Reduction *)malloc(0x30);
      loc_1.s = start_loc->s;
      loc_1.pathname = (p->user).loc.pathname;
      loc_1.ws = (p->user).loc.ws;
      loc_1.col = (p->user).loc.col;
      loc_1.line = (p->user).loc.line;
      ppDVar12 = (p->error_reductions).v;
      if (ppDVar12 == (D_Reduction **)0x0) {
        (p->error_reductions).v = ppDVar5;
        uVar26 = (p->error_reductions).n;
        (p->error_reductions).n = uVar26 + 1;
        (p->error_reductions).e[uVar26] = elem;
      }
      else {
        uVar26 = v->n;
        if (ppDVar12 == ppDVar5) {
          if (2 < uVar26) goto LAB_00142e8d;
        }
        else if ((uVar26 & 7) == 0) {
LAB_00142e8d:
          vec_add_internal(v,elem);
          goto LAB_00142e9a;
        }
        v->n = uVar26 + 1;
        ppDVar12[uVar26] = elem;
      }
LAB_00142e9a:
      uVar8 = local_198->depth;
      elem->nelements = uVar8 + 1;
      elem->symbol = local_198->symbol;
      iVar24 = loc_1.line;
      for (; loc_1.s < local_1b0; loc_1.s = loc_1.s + 1) {
        if (*loc_1.s == '\n') {
          iVar24 = iVar24 + 1;
          loc_1.line = iVar24;
        }
      }
      loc_1.s = local_1b0;
      pPVar29 = (PNode *)0x0;
      for (uVar40 = 0; (local_1e0->zns).n != uVar40; uVar40 = uVar40 + 1) {
        pZVar30 = (local_1e0->zns).v[uVar40];
        if ((pZVar30 != (ZNode *)0x0) &&
           ((pPVar15 = pZVar30->pn, pPVar29 == (PNode *)0x0 ||
            ((pPVar29->parse_node).start_loc.s < (pPVar15->parse_node).start_loc.s)))) {
          pPVar29 = pPVar15;
        }
      }
      (*(p->user).initial_white_space_fn)(&p->user,&loc_1,(void **)p);
      pPVar29 = add_PNode(p,0,start_loc,loc_1.s,pPVar29,(D_Reduction *)0x0,(VecZNode *)0x0,
                          (D_Shift *)0x0);
      pSVar28 = new_SNode(p,local_1e0->state,&loc_1,pPVar29->initial_scope);
      pPVar29->refcount = pPVar29->refcount + 1;
      pSVar28->last_pn = pPVar29;
      pZVar30 = new_ZNode(p,pPVar29);
      set_add_znode(&pSVar28->zns,pZVar30);
      ppSVar16 = (pZVar30->sns).v;
      ppSVar41 = (pZVar30->sns).e;
      if (ppSVar16 == (SNode **)0x0) {
        (pZVar30->sns).v = ppSVar41;
        uVar26 = (pZVar30->sns).n;
        (pZVar30->sns).n = uVar26 + 1;
        (pZVar30->sns).e[uVar26] = local_1e0;
      }
      else {
        v_00 = &pZVar30->sns;
        uVar26 = v_00->n;
        if (ppSVar16 == ppSVar41) {
          if (2 < uVar26) goto LAB_00143009;
        }
        else if ((uVar26 & 7) == 0) {
LAB_00143009:
          vec_add_internal(v_00,local_1e0);
          goto LAB_00143017;
        }
        v_00->n = uVar26 + 1;
        ppSVar16[uVar26] = local_1e0;
      }
LAB_00143017:
      local_1e0->refcount = local_1e0->refcount + 1;
      pRVar32->znode = pZVar30;
      pSVar28->refcount = pSVar28->refcount + 1;
      pRVar32->snode = pSVar28;
      pRVar32->reduction = elem;
      pRVar32->new_snode = (SNode *)0x0;
      pRVar32->next = (Reduction *)0x0;
      free_old_nodes(p);
      free_old_nodes(p);
      reduce_one(p,pRVar32);
      uVar26 = (p->snode_hash).m;
      for (uVar40 = 0; uVar40 != uVar26; uVar40 = uVar40 + 1) {
        ppSVar41 = (p->snode_hash).v + uVar40;
        while (pSVar28 = *ppSVar41, pSVar28 != (SNode *)0x0) {
          uVar23 = (pSVar28->zns).n;
          for (uVar39 = 0; uVar23 != uVar39; uVar39 = uVar39 + 1) {
            pZVar30 = (pSVar28->zns).v[uVar39];
            if ((pZVar30 != (ZNode *)0x0) && (pPVar29 = pZVar30->pn, pPVar29->reduction == elem)) {
              pPVar29->evaluated = '\x01';
              pPVar29->error_recovery = '\x01';
            }
          }
          ppSVar41 = &pSVar28->bucket_next;
        }
      }
      if ((*ppSVar3 == (Shift *)0x0) && (p->reductions_todo == (Reduction *)0x0)) {
LAB_001435e9:
        free(__ptr);
        return 1;
      }
      free(__ptr);
    }
LAB_00142cac:
    if (((p->user).dont_compare_stacks == 0) && (__ptr_00->next != (Shift *)0x0)) {
      pcVar10 = (__ptr_00->snode->loc).s;
      ppSVar50 = ppSVar3;
      while ((__ptr_00 != (Shift *)0x0 && (pSVar28 = __ptr_00->snode, (pSVar28->loc).s == pcVar10)))
      {
        pZVar30 = binary_op_ZNode(pSVar28);
        pSVar51 = __ptr_00;
        if (pZVar30 != (ZNode *)0x0) {
LAB_00142d0c:
          do {
            do {
              do {
                ppSVar43 = &pSVar51->next;
                pSVar51 = *ppSVar43;
                if ((pSVar51 == (Shift *)0x0) ||
                   (pSVar13 = pSVar51->snode, (pSVar13->loc).s != pcVar10)) goto LAB_00142deb;
                pZVar33 = binary_op_ZNode(pSVar13);
              } while ((pZVar33 == (ZNode *)0x0) ||
                      (uVar26 = (pZVar30->sns).n, uVar26 != (pZVar33->sns).n));
              for (uVar40 = 0; uVar40 != uVar26; uVar40 = uVar40 + 1) {
                uVar39 = 0;
                do {
                  if (uVar26 == uVar39) goto LAB_00142d0c;
                  ppSVar41 = (pZVar33->sns).v + uVar39;
                  uVar39 = uVar39 + 1;
                } while ((pZVar30->sns).v[uVar40] != *ppSVar41);
              }
              pDVar14 = p->t->state;
            } while ((((long)pSVar13->state - (long)pDVar14) / 0x78 !=
                      (long)pSVar28->state->reduces_to) &&
                    (((long)pSVar28->state - (long)pDVar14) / 0x78 !=
                     (long)pSVar13->state->reduces_to));
            iVar24 = pZVar33->pn->op_priority;
            iVar9 = pZVar30->pn->op_priority;
            if (iVar24 < iVar9) {
              *ppSVar43 = pSVar51->next;
              pSVar28 = pSVar51->snode;
              puVar1 = &pSVar28->refcount;
              *puVar1 = *puVar1 - 1;
              if (*puVar1 == 0) {
                free_SNode(p,pSVar28);
              }
              free(pSVar51);
              goto LAB_00142deb;
            }
          } while (iVar24 <= iVar9);
          *ppSVar50 = __ptr_00->next;
          pSVar28 = __ptr_00->snode;
          puVar1 = &pSVar28->refcount;
          *puVar1 = *puVar1 - 1;
          if (*puVar1 == 0) {
            free_SNode(p,pSVar28);
          }
          free(__ptr_00);
          __ptr_00 = *ppSVar50;
        }
LAB_00142deb:
        ppSVar50 = &__ptr_00->next;
        __ptr_00 = __ptr_00->next;
      }
      __ptr_00 = *ppSVar3;
    }
    pcVar10 = (__ptr_00->snode->loc).s;
    if (local_1b8 < pcVar10) {
      free_old_nodes(p);
      __ptr_00 = p->shifts_todo;
      local_1b8 = pcVar10;
    }
    iVar24 = iVar27 + 1;
    iVar9 = 0;
    if (iVar27 < (p->user).commit_actions_interval) {
LAB_00143124:
      bVar19 = false;
    }
    else {
      if ((__ptr_00->next == (Shift *)0x0) && (p->reductions_todo == (Reduction *)0x0)) {
        iVar27 = commit_stack(p,__ptr_00->snode);
        if (iVar27 == -4) {
          return -1;
        }
        __ptr_00 = *ppSVar3;
        iVar24 = 0;
        goto LAB_00143124;
      }
      bVar19 = true;
    }
    pSVar28 = __ptr_00->snode;
    loc_1.s = (pSVar28->loc).s;
    loc_1.pathname = (pSVar28->loc).pathname;
    loc_1.ws = (pSVar28->loc).ws;
    loc_1.col = (pSVar28->loc).col;
    loc_1.line = (pSVar28->loc).line;
    local_158.s = (char *)0x0;
    uVar40 = 0;
    pSVar51 = __ptr_00;
    while ((iVar27 = (int)uVar40, pSVar51 != (Shift *)0x0 &&
           (pSVar28 = pSVar51->snode, (pSVar28->loc).s == pcVar10))) {
      uVar26 = p->t->nsymbols;
      pSVar42 = pSVar51;
      if ((uint)(p->nshift_results - iVar27) < uVar26 * 2) {
        iVar25 = uVar26 * 3 + iVar27;
        p->nshift_results = iVar25;
        pSVar34 = (ShiftResult *)realloc(p->shift_results,(long)iVar25 * 0x30);
        p->shift_results = pSVar34;
        pSVar42 = p->shifts_todo;
        pSVar28 = pSVar51->snode;
      }
      p->shifts_todo = pSVar42->next;
      p->scans = p->scans + 1;
      pDVar14 = pSVar28->state;
      if (pDVar14->scanner_code != (D_ScanCode)0x0) {
        pDVar35 = p->code_shifts;
        if (p->ncode_shifts <= iVar9) {
          p->ncode_shifts = iVar9 + 2;
          pDVar35 = (D_Shift *)realloc(pDVar35,(long)(iVar9 + 2) * 0x18);
          p->code_shifts = pDVar35;
        }
        pDVar35[iVar9].shift_kind = '\0';
        pDVar35[iVar9].op_assoc = '\0';
        pDVar35 = pDVar35 + iVar9;
        pDVar35->term_priority = 0;
        pDVar35->action_index = 0;
        *(D_ReductionCode *)(&pDVar35->term_priority + 2) = (D_ReductionCode)0x0;
        pSVar34 = p->shift_results;
        pdVar18 = &pSVar34[uVar40].loc;
        *(undefined4 *)&pdVar18->ws = loc_1.ws._0_4_;
        *(undefined4 *)((long)&pdVar18->ws + 4) = loc_1.ws._4_4_;
        *(int *)(&pdVar18->ws + 1) = loc_1.col;
        pdVar18->line = loc_1.line;
        pdVar18 = &pSVar34[uVar40].loc;
        *(undefined4 *)&pdVar18->s = loc_1.s._0_4_;
        *(undefined4 *)((long)&pdVar18->s + 4) = loc_1.s._4_4_;
        *(undefined4 *)&pdVar18->pathname = loc_1.pathname._0_4_;
        *(undefined4 *)((long)&pdVar18->pathname + 4) = loc_1.pathname._4_4_;
        pDVar35 = p->code_shifts;
        iVar25 = (*pDVar14->scanner_code)
                           (&p->shift_results[uVar40].loc,&pDVar35[iVar9].symbol,
                            &pDVar35[iVar9].term_priority,&pDVar35[iVar9].op_assoc,
                            &pDVar35[iVar9].op_priority);
        if (iVar25 != 0) {
          pSVar34 = p->shift_results;
          pSVar34[uVar40].snode = pSVar51->snode;
          pSVar34[uVar40].shift = p->code_shifts + iVar9;
          uVar40 = (ulong)(iVar27 + 1);
          iVar9 = iVar9 + 1;
        }
      }
      if (pDVar14->scanner_table != (void *)0x0) {
        iVar27 = (int)uVar40;
        uVar26 = scan_buffer(&loc_1,pDVar14,p->shift_results + uVar40);
        uVar39 = (ulong)uVar26;
        while (bVar53 = uVar39 != 0, uVar39 = uVar39 - 1, bVar53) {
          p->shift_results[uVar40].snode = pSVar51->snode;
          uVar40 = (ulong)((int)uVar40 + 1);
        }
        uVar40 = (ulong)(uVar26 + iVar27);
      }
      pSVar51 = *ppSVar3;
    }
    lVar36 = 0;
    for (uVar39 = 0; uVar39 != uVar40; uVar39 = uVar39 + 1) {
      pSVar34 = p->shift_results;
      pDVar35 = pSVar34[uVar39].shift;
      if (pDVar35 != (D_Shift *)0x0) {
        ppDVar44 = &pSVar34[uVar39].shift;
        if (pDVar35->shift_kind == '\x03') {
          uVar7 = pDVar35->symbol;
          pSVar28 = pSVar34[uVar39].snode;
          ppDVar46 = ppDVar44;
          uVar52 = uVar39;
          do {
            *ppDVar46 = (D_Shift *)0x0;
            ppDVar46 = &pSVar34[uVar52 + 1].shift;
            while( true ) {
              uVar52 = uVar52 + 1;
              if (uVar40 <= uVar52) {
                pDVar35 = *ppDVar44;
                if (pDVar35 == (D_Shift *)0x0) goto LAB_00143437;
                goto LAB_001433ef;
              }
              pDVar35 = *ppDVar46;
              if (((pDVar35 != (D_Shift *)0x0) &&
                  (pSVar28 == ((ShiftResult *)(ppDVar46 + -1))->snode)) &&
                 (uVar7 == pDVar35->symbol)) break;
              ppDVar46 = ppDVar46 + 6;
            }
            *ppDVar44 = pDVar35;
          } while( true );
        }
LAB_001433ef:
        if (pDVar35->term_priority != 0) {
          for (lVar45 = 0; uVar40 * 0x30 - lVar45 != 0; lVar45 = lVar45 + 0x30) {
            lVar17 = *(long *)((long)&pSVar34->shift + lVar45);
            if (((lVar17 != 0) && (lVar36 != lVar45)) &&
               (pSVar34[uVar39].loc.s == *(char **)((long)&(pSVar34->loc).s + lVar45))) {
              iVar27 = *(int *)(lVar17 + 8);
              if ((*ppDVar44)->term_priority < iVar27) {
                *ppDVar44 = (D_Shift *)0x0;
                break;
              }
              if (iVar27 < (*ppDVar44)->term_priority) {
                *(undefined8 *)((long)&pSVar34->shift + lVar45) = 0;
              }
            }
          }
        }
      }
LAB_00143437:
      lVar36 = lVar36 + 0x30;
    }
    for (lVar36 = 0; uVar40 * 0x30 - lVar36 != 0; lVar36 = lVar36 + 0x30) {
      pSVar34 = p->shift_results;
      pDVar35 = *(D_Shift **)((long)&pSVar34->shift + lVar36);
      if (pDVar35 != (D_Shift *)0x0) {
        p->shifts = p->shifts + 1;
        pdVar18 = *(d_loc_t **)((long)&pSVar34->snode + lVar36);
        pPVar29 = add_PNode(p,(uint)pDVar35->symbol,pdVar18,
                            *(char **)((long)&(pSVar34->loc).s + lVar36),*(PNode **)&pdVar18[1].col,
                            (D_Reduction *)0x0,(VecZNode *)0x0,pDVar35);
        if (pPVar29 != (PNode *)0x0) {
          plVar48 = (long *)((long)&(pSVar34->loc).s + lVar36);
          if ((local_158.s == (char *)0x0) || (local_158.s != (char *)*plVar48)) {
            local_158.s = (char *)*plVar48;
            local_158.pathname._0_4_ = *(undefined4 *)((long)&(pSVar34->loc).pathname + lVar36);
            local_158.pathname._4_4_ = *(undefined4 *)((long)&(pSVar34->loc).pathname + lVar36 + 4);
            local_158.ws = *(char **)((long)&(pSVar34->loc).ws + lVar36);
            local_158.col = *(int *)((long)&(pSVar34->loc).col + lVar36);
            local_158.line = *(int *)((long)&(pSVar34->loc).line + lVar36);
            (*(p->user).initial_white_space_fn)(&p->user,&local_158,(void **)p);
            local_158.ws = (char *)*plVar48;
            pPVar29->ws_before = loc_1.ws;
            pPVar29->ws_after = local_158.s;
          }
          goto_PNode(p,&local_158,pPVar29,*(SNode **)((long)&pSVar34->snode + lVar36));
        }
      }
    }
    while ((__ptr_00 != (Shift *)0x0 && (pSVar28 = __ptr_00->snode, (pSVar28->loc).s == pcVar10))) {
      pSVar51 = __ptr_00->next;
      puVar1 = &pSVar28->refcount;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        free_SNode(p,pSVar28);
      }
      __ptr_00->next = p->free_shifts;
      p->free_shifts = __ptr_00;
      __ptr_00 = pSVar51;
    }
    iVar27 = iVar24;
    if (((bVar19) && (pRVar32 = p->reductions_todo, pRVar32 != (Reduction *)0x0)) &&
       (pRVar32->next == (Reduction *)0x0)) {
      iVar24 = commit_stack(p,pRVar32->snode);
      iVar27 = 0;
      if (iVar24 == -4) {
        return -1;
      }
    }
  } while( true );
}

Assistant:

static int exhaustive_parse(Parser *p, int state) {
  Reduction *r;
  char *pos, *epos = NULL;
  PNode *pn, tpn;
  SNode *sn;
  ZNode *z;
  int progress = 0, ready = 0;
  d_loc_t loc;

  pos = p->user.loc.ws = p->user.loc.s = p->start;
  loc = p->user.loc;
  p->user.initial_white_space_fn((D_Parser *)p, &loc, &p->user.initial_globals);
  /* initial state */
  sn = add_SNode(p, &p->t->state[state], &loc, p->top_scope);
  memset(&tpn, 0, sizeof(tpn));
  tpn.initial_scope = tpn.parse_node.scope = p->top_scope;
  tpn.parse_node.end = loc.s;
  if (sn->last_pn) unref_pn(p, sn->last_pn);
  pn = add_PNode(p, 0, &loc, loc.s, &tpn, 0, 0, 0);
  ref_pn(pn);
  sn->last_pn = pn;
  set_add_znode(&sn->zns, (z = new_ZNode(p, pn)));
  while (1) {
    /* reduce all */
    while (p->reductions_todo) {
      pos = p->reductions_todo->snode->loc.s;
      if (p->shifts_todo && p->shifts_todo->snode->loc.s < pos) break;
      if (pos > epos) {
        epos = pos;
        free_old_nodes(p);
      }
      for (; (r = p->reductions_todo) && r->snode->loc.s == pos;) {
        p->reductions_todo = p->reductions_todo->next;
        reduce_one(p, r);
      }
    }
    /* done? */
    if (!p->shifts_todo) {
      if (p->accept && (p->accept->loc.s == p->end || p->user.partial_parses))
        return 0;
      else {
        if (error_recovery(p)) return 1;
        continue;
      }
    } else if (!p->user.dont_compare_stacks && p->shifts_todo->next)
      cmp_stacks(p);
    /* shift all */
    pos = p->shifts_todo->snode->loc.s;
    if (pos > epos) {
      epos = pos;
      free_old_nodes(p);
    }
    progress++;
    ready = progress > p->user.commit_actions_interval;
    if (ready && !p->shifts_todo->next && !p->reductions_todo) {
      if (commit_stack(p, p->shifts_todo->snode) == -4)
        return -1;
      ready = progress = 0;
    }
    shift_all(p, pos);
    if (ready && p->reductions_todo && !p->reductions_todo->next) {
      if (commit_stack(p, p->reductions_todo->snode) == -4)
        return -1;
      progress = 0;
    }
  }
}